

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

void __thiscall
QConcatenateTablesProxyModel::addSourceModel
          (QConcatenateTablesProxyModel *this,QAbstractItemModel *sourceModel)

{
  QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator> rhs;
  QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator> lhs;
  long *plVar1;
  bool bVar2;
  int iVar3;
  QConcatenateTablesProxyModelPrivate *pQVar4;
  long *in_RSI;
  long in_FS_OFFSET;
  QByteArray *v;
  int *k;
  QKeyValueRange<const_QHash<int,_QByteArray>_&> *__range2;
  int newRows;
  QConcatenateTablesProxyModelPrivate *d;
  const_key_value_iterator __end2;
  const_key_value_iterator __begin2;
  QHash<int,_QByteArray> newRoleNames;
  code *args;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this_00;
  size_t in_stack_fffffffffffffbb8;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *in_stack_fffffffffffffbc0;
  QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator>
  *in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  QConcatenateTablesProxyModelPrivate *in_stack_fffffffffffffbd8;
  QAbstractItemModel *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffc20;
  ConnectionType type;
  Object *receiverPrivate;
  Object *sender;
  Function in_stack_fffffffffffffc50;
  offset_in_QAbstractItemModel_to_subr in_stack_fffffffffffffc60;
  undefined1 local_c8 [24];
  long *local_b0;
  Object local_90 [8];
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = in_RSI;
  pQVar4 = d_func((QConcatenateTablesProxyModel *)0x8587f1);
  plVar1 = local_b0;
  QModelIndex::QModelIndex((QModelIndex *)0x858816);
  iVar3 = (**(code **)(*plVar1 + 0x78))(plVar1,local_c8);
  if (0 < iVar3) {
    QModelIndex::QModelIndex((QModelIndex *)0x85884a);
    QAbstractItemModel::beginInsertRows
              (in_stack_fffffffffffffbe0,(QModelIndex *)in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0);
  }
  pQVar4->m_rowCount = pQVar4->m_rowCount + iVar3;
  receiverPrivate = (Object *)&pQVar4->m_models;
  sender = local_90;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QConcatenateTablesProxyModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QConcatenateTablesProxyModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)()>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  args = QConcatenateTablesProxyModelPrivate::slotModelReset;
  this_00 = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)()>
            (sender,in_stack_fffffffffffffc60,receiverPrivate,in_stack_fffffffffffffc50,type);
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::
  emplace_back<QAbstractItemModel*&,std::array<QMetaObject::Connection,17ul>>
            ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)this_00,
             (QAbstractItemModel **)args,(array<QMetaObject::Connection,_17UL> *)0x85917b);
  std::array<QMetaObject::Connection,_17UL>::~array
            ((array<QMetaObject::Connection,_17UL> *)in_stack_fffffffffffffbc0);
  if ((*(uint *)&pQVar4->field_0x104 & 1) == 0) {
    (**(code **)(*local_b0 + 0x160))();
    QHash<int,_QByteArray>::asKeyValueRange((QHash<int,_QByteArray> *)this_00);
    QtPrivate::QKeyValueRange<const_QHash<int,_QByteArray>_&>::begin
              ((QKeyValueRange<const_QHash<int,_QByteArray>_&> *)0x859233);
    QtPrivate::QKeyValueRange<const_QHash<int,_QByteArray>_&>::end
              ((QKeyValueRange<const_QHash<int,_QByteArray>_&> *)0x859275);
    while( true ) {
      lhs.i.i.bucket = (size_t)in_stack_fffffffffffffbc8;
      lhs.i.i.d = in_stack_fffffffffffffbc0;
      rhs.i.i.bucket = in_stack_fffffffffffffbb8;
      rhs.i.i.d = this_00;
      bVar2 = ::operator!=(lhs,rhs);
      if (!bVar2) break;
      QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator>::
      operator*(in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbd8 = (QConcatenateTablesProxyModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      std::get<0ul,int_const&,QByteArray_const&>((pair<const_int_&,_const_QByteArray_&> *)0x859382);
      std::get<1ul,int_const&,QByteArray_const&>((pair<const_int_&,_const_QByteArray_&> *)0x8593a7);
      QHash<int,QByteArray>::insert_or_assign<QByteArray_const&>
                ((QHash<int,_QByteArray> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int *)in_stack_fffffffffffffbc8,(QByteArray *)in_stack_fffffffffffffbc0);
      QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator>::
      operator++((QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator>
                  *)this_00);
    }
    QHash<int,_QByteArray>::~QHash((QHash<QByteArray,_QTzTimeZone> *)this_00);
  }
  if (0 < iVar3) {
    QAbstractItemModel::endInsertRows((QAbstractItemModel *)in_stack_fffffffffffffbc8);
  }
  QConcatenateTablesProxyModelPrivate::updateColumnCount(in_stack_fffffffffffffbd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModel::addSourceModel(QAbstractItemModel *sourceModel)
{
    Q_D(QConcatenateTablesProxyModel);
    Q_ASSERT(sourceModel);
    Q_ASSERT(!d->containsSourceModel(sourceModel));

    const int newRows = sourceModel->rowCount();
    if (newRows > 0)
        beginInsertRows(QModelIndex(), d->m_rowCount, d->m_rowCount + newRows - 1);
    d->m_rowCount += newRows;
    d->m_models.emplace_back(sourceModel, std::array{
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::dataChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotDataChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsMoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeMoved),

        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsMoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeMoved),

        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::layoutAboutToBeChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotSourceLayoutAboutToBeChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::layoutChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotSourceLayoutChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::modelAboutToBeReset,
                                d, &QConcatenateTablesProxyModelPrivate::slotModelAboutToBeReset),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::modelReset,
                                d, &QConcatenateTablesProxyModelPrivate::slotModelReset),
    });
    if (!d->m_roleNamesDirty) {
        // do update immediately, since append() is a simple update:
        const auto newRoleNames = sourceModel->roleNames();
        for (const auto &[k, v] : newRoleNames.asKeyValueRange())
            d->m_roleNames.insert_or_assign(k, v);
    }
    if (newRows > 0)
        endInsertRows();

    d->updateColumnCount();
}